

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BER.h
# Opt level: O0

void __thiscall OctetType::~OctetType(OctetType *this)

{
  OctetType *this_local;
  
  (this->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__OctetType_0013c5b8;
  std::__cxx11::string::~string((string *)&this->_value);
  BER_CONTAINER::~BER_CONTAINER(&this->super_BER_CONTAINER);
  return;
}

Assistant:

explicit OctetType(const std::string& value): BER_CONTAINER(STRING), _value(value){}